

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersector1<8,_1,_false,_embree::avx2::ArrayIntersector1<embree::avx2::TriangleMvIntersector1Woop<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  Geometry *pGVar2;
  RTCRayQueryContext *pRVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined4 uVar16;
  int iVar17;
  uint uVar18;
  undefined1 (*pauVar19) [16];
  uint uVar20;
  ulong uVar21;
  long lVar22;
  undefined1 (*pauVar23) [16];
  int *piVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 (*pauVar27) [16];
  ulong uVar28;
  long lVar29;
  ulong unaff_R15;
  size_t mask;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  uint uVar58;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_26a4;
  undefined1 local_26a0 [16];
  RTCIntersectArguments *local_2688;
  RTCFilterFunctionNArguments local_2680;
  undefined1 local_2650 [16];
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  undefined1 local_2620 [16];
  Geometry *local_2610;
  int *local_2608;
  Scene *local_2600;
  ulong local_25f8;
  ulong local_25f0;
  undefined1 (*local_25e8) [16];
  ulong local_25e0;
  ulong local_25d8;
  ulong local_25d0;
  ulong local_25c8;
  float local_25c0;
  undefined4 local_25bc;
  undefined4 local_25b8;
  float local_25b4;
  float local_25b0;
  undefined4 local_25ac;
  uint local_25a8;
  uint local_25a4;
  uint local_25a0;
  undefined8 local_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [32];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  float local_2530 [4];
  float local_2520 [4];
  undefined1 local_2510 [16];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [2] [16];
  undefined1 local_24c0 [32];
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  float local_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float local_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar66 [64];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    auVar30._8_4_ = 0x7fffffff;
    auVar30._0_8_ = 0x7fffffff7fffffff;
    auVar30._12_4_ = 0x7fffffff;
    aVar1 = (ray->super_RayK<1>).dir.field_0;
    auVar30 = vandps_avx((undefined1  [16])aVar1,auVar30);
    auVar35 = vshufps_avx(auVar30,auVar30,0xf5);
    auVar56 = vshufps_avx(auVar30,auVar30,0x4e);
    auVar36 = vmaxss_avx(auVar30,auVar35);
    uVar20 = 2;
    if (auVar56._0_4_ < auVar36._0_4_) {
      uVar20 = (uint)(auVar30._0_4_ <= auVar35._0_4_);
    }
    uVar18 = uVar20 + 1;
    if (uVar20 + 1 == 3) {
      uVar18 = 0;
    }
    uVar25 = (ulong)(uVar18 + 1);
    if (uVar18 + 1 == 3) {
      uVar25 = 0;
    }
    uVar26 = uVar25;
    uVar12 = (ulong)uVar18;
    if ((float)ray->instID[(ulong)uVar20 - 0xf] < 0.0) {
      uVar26 = (ulong)uVar18;
      uVar12 = uVar25;
    }
    uVar18 = ray->instID[uVar12 - 0x13];
    auVar62 = ZEXT1664(CONCAT412(uVar18,CONCAT48(uVar18,CONCAT44(uVar18,uVar18))));
    uVar18 = ray->instID[uVar26 - 0x13];
    auVar63 = ZEXT1664(CONCAT412(uVar18,CONCAT48(uVar18,CONCAT44(uVar18,uVar18))));
    uVar18 = ray->instID[(ulong)uVar20 - 0x13];
    auVar64 = ZEXT1664(CONCAT412(uVar18,CONCAT48(uVar18,CONCAT44(uVar18,uVar18))));
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      auVar35 = ZEXT416(ray->instID[(ulong)uVar20 - 0xf]);
      auVar36 = vrcpss_avx(auVar35,auVar35);
      auVar35 = vfnmadd213ss_fma(auVar35,auVar36,ZEXT416(0x40000000));
      local_2450 = auVar36._0_4_ * auVar35._0_4_;
      local_2440 = (float)ray->instID[uVar26 - 0xf] * local_2450;
      auVar36 = vmaxss_avx(ZEXT816(0) << 0x20,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar35 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar56._8_4_ = 0x219392ef;
      auVar56._0_8_ = 0x219392ef219392ef;
      auVar56._12_4_ = 0x219392ef;
      auVar30 = vcmpps_avx(auVar30,auVar56,1);
      auVar30 = vblendvps_avx((undefined1  [16])aVar1,auVar56,auVar30);
      local_2430 = (float)ray->instID[uVar12 - 0xf] * local_2450;
      auVar56 = vrcpps_avx(auVar30);
      auVar65._8_4_ = 0x3f800000;
      auVar65._0_8_ = &DAT_3f8000003f800000;
      auVar65._12_4_ = 0x3f800000;
      auVar66 = ZEXT1664(auVar65);
      auVar30 = vfnmadd213ps_fma(auVar30,auVar56,auVar65);
      auVar41 = vfmadd132ps_fma(auVar30,auVar56,auVar56);
      fVar51 = auVar41._0_4_;
      local_25e8 = (undefined1 (*) [16])local_2390;
      local_23c0._4_4_ = fVar51;
      local_23c0._0_4_ = fVar51;
      local_23c0._8_4_ = fVar51;
      local_23c0._12_4_ = fVar51;
      local_23c0._16_4_ = fVar51;
      local_23c0._20_4_ = fVar51;
      local_23c0._24_4_ = fVar51;
      local_23c0._28_4_ = fVar51;
      auVar30 = vmovshdup_avx(auVar41);
      local_2480 = auVar30._0_8_;
      uStack_2478 = local_2480;
      uStack_2470 = local_2480;
      uStack_2468 = local_2480;
      auVar65 = vshufpd_avx(auVar41,auVar41,1);
      auVar56 = vshufps_avx(auVar41,auVar41,0xaa);
      local_24a0 = auVar56._0_8_;
      uStack_2498 = local_24a0;
      uStack_2490 = local_24a0;
      uStack_2488 = local_24a0;
      auVar60._0_4_ = fVar51 * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar60._4_4_ = auVar41._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
      auVar60._8_4_ = auVar41._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
      auVar60._12_4_ = auVar41._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
      auVar56 = vmovshdup_avx(auVar60);
      auVar41 = vshufps_avx(auVar60,auVar60,0xaa);
      local_25f0 = (ulong)(fVar51 < 0.0) << 5;
      local_25f8 = (ulong)(auVar30._0_4_ < 0.0) << 5 | 0x40;
      local_25c8 = (ulong)(auVar65._0_4_ < 0.0) << 5 | 0x80;
      local_25d0 = local_25f0 ^ 0x20;
      local_25d8 = local_25f8 ^ 0x20;
      local_25e0 = local_25c8 ^ 0x20;
      uVar16 = auVar35._0_4_;
      auVar34._4_4_ = uVar16;
      auVar34._0_4_ = uVar16;
      auVar34._8_4_ = uVar16;
      auVar34._12_4_ = uVar16;
      auVar34._16_4_ = uVar16;
      auVar34._20_4_ = uVar16;
      auVar34._24_4_ = uVar16;
      auVar34._28_4_ = uVar16;
      uVar25 = CONCAT44(auVar60._0_4_,auVar60._0_4_);
      local_23e0._0_8_ = uVar25 ^ 0x8000000080000000;
      local_23e0._8_4_ = -auVar60._0_4_;
      local_23e0._12_4_ = -auVar60._0_4_;
      local_23e0._16_4_ = -auVar60._0_4_;
      local_23e0._20_4_ = -auVar60._0_4_;
      local_23e0._24_4_ = -auVar60._0_4_;
      local_23e0._28_4_ = -auVar60._0_4_;
      uVar18 = auVar56._0_4_;
      uVar58 = auVar56._4_4_;
      local_2400._0_8_ = auVar56._0_8_ ^ 0x8000000080000000;
      local_2400._8_4_ = uVar18 ^ 0x80000000;
      local_2400._12_4_ = uVar58 ^ 0x80000000;
      local_2400._16_4_ = uVar18 ^ 0x80000000;
      local_2400._20_4_ = uVar58 ^ 0x80000000;
      local_2400._24_4_ = uVar18 ^ 0x80000000;
      local_2400._28_4_ = uVar58 ^ 0x80000000;
      uVar18 = auVar41._0_4_;
      uVar58 = auVar41._4_4_;
      local_2420._0_8_ = auVar41._0_8_ ^ 0x8000000080000000;
      local_2420._8_4_ = uVar18 ^ 0x80000000;
      local_2420._12_4_ = uVar58 ^ 0x80000000;
      local_2420._16_4_ = uVar18 ^ 0x80000000;
      local_2420._20_4_ = uVar58 ^ 0x80000000;
      local_2420._24_4_ = uVar18 ^ 0x80000000;
      local_2420._28_4_ = uVar58 ^ 0x80000000;
      uVar16 = auVar36._0_4_;
      local_24c0._4_4_ = uVar16;
      local_24c0._0_4_ = uVar16;
      local_24c0._8_4_ = uVar16;
      local_24c0._12_4_ = uVar16;
      local_24c0._16_4_ = uVar16;
      local_24c0._20_4_ = uVar16;
      local_24c0._24_4_ = uVar16;
      local_24c0._28_4_ = uVar16;
      local_2590 = mm_lookupmask_ps._240_8_;
      uStack_2588 = mm_lookupmask_ps._248_8_;
      fStack_242c = local_2430;
      fStack_2428 = local_2430;
      fStack_2424 = local_2430;
      fStack_243c = local_2440;
      fStack_2438 = local_2440;
      fStack_2434 = local_2440;
      fStack_244c = local_2450;
      fStack_2448 = local_2450;
      fStack_2444 = local_2450;
      do {
        auVar50 = ZEXT3264(local_2400);
        auVar53 = ZEXT3264(CONCAT824(uStack_2468,
                                     CONCAT816(uStack_2470,CONCAT88(uStack_2478,local_2480))));
        auVar55 = ZEXT3264(CONCAT824(uStack_2488,
                                     CONCAT816(uStack_2490,CONCAT88(uStack_2498,local_24a0))));
        do {
          do {
            if (local_25e8 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            pauVar27 = local_25e8 + -1;
            local_25e8 = local_25e8 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar27 + 8));
          uVar25 = *(ulong *)*local_25e8;
          do {
            auVar49 = auVar50._0_32_;
            if ((uVar25 & 8) == 0) {
              auVar30 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar25 + 0x40 + local_25f0),
                                        local_23e0,local_23c0);
              auVar36 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar25 + 0x40 + local_25f8),auVar49,
                                        auVar53._0_32_);
              auVar9 = vpmaxsd_avx2(ZEXT1632(auVar30),ZEXT1632(auVar36));
              auVar30 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar25 + 0x40 + local_25c8),
                                        local_2420,auVar55._0_32_);
              auVar10 = vpmaxsd_avx2(ZEXT1632(auVar30),local_24c0);
              local_2580 = vpmaxsd_avx2(auVar9,auVar10);
              auVar30 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar25 + 0x40 + local_25d0),
                                        local_23e0,local_23c0);
              auVar36 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar25 + 0x40 + local_25d8),auVar49,
                                        auVar53._0_32_);
              auVar9 = vpminsd_avx2(ZEXT1632(auVar30),ZEXT1632(auVar36));
              auVar30 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar25 + 0x40 + local_25e0),
                                        local_2420,auVar55._0_32_);
              auVar10 = vpminsd_avx2(ZEXT1632(auVar30),auVar34);
              auVar9 = vpminsd_avx2(auVar9,auVar10);
              auVar9 = vpcmpgtd_avx2(local_2580,auVar9);
              uVar16 = vmovmskps_avx(auVar9);
              unaff_R15 = (ulong)(byte)~(byte)uVar16;
            }
            if ((uVar25 & 8) == 0) {
              if (unaff_R15 == 0) {
                iVar17 = 4;
              }
              else {
                uVar28 = uVar25 & 0xfffffffffffffff0;
                lVar29 = 0;
                for (uVar25 = unaff_R15; (uVar25 & 1) == 0;
                    uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                  lVar29 = lVar29 + 1;
                }
                iVar17 = 0;
                uVar21 = unaff_R15 - 1 & unaff_R15;
                uVar25 = *(ulong *)(uVar28 + lVar29 * 8);
                if (uVar21 != 0) {
                  uVar18 = *(uint *)(local_2580 + lVar29 * 4);
                  lVar29 = 0;
                  for (uVar11 = uVar21; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000
                      ) {
                    lVar29 = lVar29 + 1;
                  }
                  uVar21 = uVar21 - 1 & uVar21;
                  uVar11 = *(ulong *)(uVar28 + lVar29 * 8);
                  uVar58 = *(uint *)(local_2580 + lVar29 * 4);
                  if (uVar21 == 0) {
                    if (uVar18 < uVar58) {
                      *(ulong *)*local_25e8 = uVar11;
                      *(uint *)(*local_25e8 + 8) = uVar58;
                      local_25e8 = local_25e8 + 1;
                    }
                    else {
                      *(ulong *)*local_25e8 = uVar25;
                      *(uint *)(*local_25e8 + 8) = uVar18;
                      uVar25 = uVar11;
                      local_25e8 = local_25e8 + 1;
                    }
                  }
                  else {
                    auVar36._8_8_ = 0;
                    auVar36._0_8_ = uVar25;
                    auVar30 = vpunpcklqdq_avx(auVar36,ZEXT416(uVar18));
                    auVar35._8_8_ = 0;
                    auVar35._0_8_ = uVar11;
                    auVar36 = vpunpcklqdq_avx(auVar35,ZEXT416(uVar58));
                    lVar29 = 0;
                    for (uVar25 = uVar21; (uVar25 & 1) == 0;
                        uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                      lVar29 = lVar29 + 1;
                    }
                    uVar21 = uVar21 - 1 & uVar21;
                    auVar41._8_8_ = 0;
                    auVar41._0_8_ = *(ulong *)(uVar28 + lVar29 * 8);
                    auVar35 = vpunpcklqdq_avx(auVar41,ZEXT416(*(uint *)(local_2580 + lVar29 * 4)));
                    if (uVar21 == 0) {
                      auVar56 = vpcmpgtd_avx(auVar36,auVar30);
                      auVar65 = vpshufd_avx(auVar56,0xaa);
                      auVar56 = vblendvps_avx(auVar36,auVar30,auVar65);
                      auVar30 = vblendvps_avx(auVar30,auVar36,auVar65);
                      auVar36 = vpcmpgtd_avx(auVar35,auVar56);
                      auVar65 = vpshufd_avx(auVar36,0xaa);
                      auVar36 = vblendvps_avx(auVar35,auVar56,auVar65);
                      auVar35 = vblendvps_avx(auVar56,auVar35,auVar65);
                      auVar56 = vpcmpgtd_avx(auVar35,auVar30);
                      auVar65 = vpshufd_avx(auVar56,0xaa);
                      auVar56 = vblendvps_avx(auVar35,auVar30,auVar65);
                      auVar30 = vblendvps_avx(auVar30,auVar35,auVar65);
                      *local_25e8 = auVar30;
                      local_25e8[1] = auVar56;
                      uVar25 = auVar36._0_8_;
                      pauVar27 = local_25e8 + 2;
                    }
                    else {
                      lVar29 = 0;
                      for (uVar25 = uVar21; (uVar25 & 1) == 0;
                          uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                        lVar29 = lVar29 + 1;
                      }
                      uVar21 = uVar21 - 1 & uVar21;
                      auVar44._8_8_ = 0;
                      auVar44._0_8_ = *(ulong *)(uVar28 + lVar29 * 8);
                      auVar56 = vpunpcklqdq_avx(auVar44,ZEXT416(*(uint *)(local_2580 + lVar29 * 4)))
                      ;
                      if (uVar21 == 0) {
                        auVar65 = vpcmpgtd_avx(auVar36,auVar30);
                        auVar41 = vpshufd_avx(auVar65,0xaa);
                        auVar65 = vblendvps_avx(auVar36,auVar30,auVar41);
                        auVar30 = vblendvps_avx(auVar30,auVar36,auVar41);
                        auVar36 = vpcmpgtd_avx(auVar56,auVar35);
                        auVar41 = vpshufd_avx(auVar36,0xaa);
                        auVar36 = vblendvps_avx(auVar56,auVar35,auVar41);
                        auVar35 = vblendvps_avx(auVar35,auVar56,auVar41);
                        auVar56 = vpcmpgtd_avx(auVar35,auVar30);
                        auVar41 = vpshufd_avx(auVar56,0xaa);
                        auVar56 = vblendvps_avx(auVar35,auVar30,auVar41);
                        auVar30 = vblendvps_avx(auVar30,auVar35,auVar41);
                        auVar35 = vpcmpgtd_avx(auVar36,auVar65);
                        auVar41 = vpshufd_avx(auVar35,0xaa);
                        auVar35 = vblendvps_avx(auVar36,auVar65,auVar41);
                        auVar36 = vblendvps_avx(auVar65,auVar36,auVar41);
                        auVar65 = vpcmpgtd_avx(auVar56,auVar36);
                        auVar41 = vpshufd_avx(auVar65,0xaa);
                        auVar65 = vblendvps_avx(auVar56,auVar36,auVar41);
                        auVar36 = vblendvps_avx(auVar36,auVar56,auVar41);
                        *local_25e8 = auVar30;
                        local_25e8[1] = auVar36;
                        local_25e8[2] = auVar65;
                        uVar25 = auVar35._0_8_;
                        pauVar27 = local_25e8 + 3;
                      }
                      else {
                        *local_25e8 = auVar30;
                        local_25e8[1] = auVar36;
                        local_25e8[2] = auVar35;
                        local_25e8[3] = auVar56;
                        lVar29 = 0x30;
                        do {
                          lVar22 = lVar29;
                          lVar29 = 0;
                          for (uVar25 = uVar21; (uVar25 & 1) == 0;
                              uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                            lVar29 = lVar29 + 1;
                          }
                          auVar37._8_8_ = 0;
                          auVar37._0_8_ = *(ulong *)(uVar28 + lVar29 * 8);
                          auVar30 = vpunpcklqdq_avx(auVar37,ZEXT416(*(uint *)(local_2580 +
                                                                             lVar29 * 4)));
                          *(undefined1 (*) [16])(local_25e8[1] + lVar22) = auVar30;
                          uVar21 = uVar21 - 1 & uVar21;
                          lVar29 = lVar22 + 0x10;
                        } while (uVar21 != 0);
                        pauVar27 = (undefined1 (*) [16])(local_25e8[1] + lVar22);
                        if (lVar22 + 0x10 != 0) {
                          lVar29 = 0x10;
                          pauVar19 = local_25e8;
                          do {
                            auVar30 = pauVar19[1];
                            uVar18 = *(uint *)(pauVar19[1] + 8);
                            pauVar19 = pauVar19 + 1;
                            lVar22 = lVar29;
                            do {
                              if (uVar18 <= *(uint *)(local_25e8[-1] + lVar22 + 8)) {
                                pauVar23 = (undefined1 (*) [16])(*local_25e8 + lVar22);
                                break;
                              }
                              *(undefined1 (*) [16])(*local_25e8 + lVar22) =
                                   *(undefined1 (*) [16])(local_25e8[-1] + lVar22);
                              lVar22 = lVar22 + -0x10;
                              pauVar23 = local_25e8;
                            } while (lVar22 != 0);
                            *pauVar23 = auVar30;
                            lVar29 = lVar29 + 0x10;
                          } while (pauVar27 != pauVar19);
                        }
                        uVar25 = *(ulong *)*pauVar27;
                      }
                      auVar53 = ZEXT3264(CONCAT824(uStack_2468,
                                                   CONCAT816(uStack_2470,
                                                             CONCAT88(uStack_2478,local_2480))));
                      auVar55 = ZEXT3264(CONCAT824(uStack_2488,
                                                   CONCAT816(uStack_2490,
                                                             CONCAT88(uStack_2498,local_24a0))));
                    }
                    auVar50 = ZEXT3264(auVar49);
                    local_25e8 = pauVar27;
                    iVar17 = 0;
                  }
                }
              }
            }
            else {
              iVar17 = 6;
            }
          } while (iVar17 == 0);
        } while (iVar17 != 6);
        uVar28 = (ulong)((uint)uVar25 & 0xf);
        if (uVar28 != 8) {
          lVar29 = 0;
          do {
            pauVar27 = (undefined1 (*) [16])(lVar29 * 0xb0 + (uVar25 & 0xfffffffffffffff0));
            auVar60 = auVar62._0_16_;
            auVar30 = vsubps_avx(pauVar27[uVar12],auVar60);
            auVar44 = auVar63._0_16_;
            auVar36 = vsubps_avx(pauVar27[uVar26],auVar44);
            auVar37 = auVar64._0_16_;
            auVar56 = vsubps_avx(pauVar27[uVar20],auVar37);
            auVar35 = vsubps_avx(pauVar27[uVar12 + 3],auVar60);
            auVar65 = vsubps_avx(pauVar27[uVar26 + 3],auVar44);
            auVar41 = vsubps_avx(pauVar27[(ulong)uVar20 + 3],auVar37);
            auVar60 = vsubps_avx(pauVar27[uVar12 + 6],auVar60);
            auVar44 = vsubps_avx(pauVar27[uVar26 + 6],auVar44);
            auVar37 = vsubps_avx(pauVar27[(ulong)uVar20 + 6],auVar37);
            auVar15._4_4_ = fStack_242c;
            auVar15._0_4_ = local_2430;
            auVar15._8_4_ = fStack_2428;
            auVar15._12_4_ = fStack_2424;
            auVar30 = vfnmadd231ps_fma(auVar30,auVar56,auVar15);
            auVar14._4_4_ = fStack_243c;
            auVar14._0_4_ = local_2440;
            auVar14._8_4_ = fStack_2438;
            auVar14._12_4_ = fStack_2434;
            auVar36 = vfnmadd231ps_fma(auVar36,auVar56,auVar14);
            auVar35 = vfnmadd231ps_fma(auVar35,auVar41,auVar15);
            auVar65 = vfnmadd231ps_fma(auVar65,auVar41,auVar14);
            auVar60 = vfnmadd231ps_fma(auVar60,auVar37,auVar15);
            auVar44 = vfnmadd231ps_fma(auVar44,auVar37,auVar14);
            auVar31._0_4_ = auVar65._0_4_ * auVar60._0_4_;
            auVar31._4_4_ = auVar65._4_4_ * auVar60._4_4_;
            auVar31._8_4_ = auVar65._8_4_ * auVar60._8_4_;
            auVar31._12_4_ = auVar65._12_4_ * auVar60._12_4_;
            auVar38._0_4_ = auVar35._0_4_ * auVar44._0_4_;
            auVar38._4_4_ = auVar35._4_4_ * auVar44._4_4_;
            auVar38._8_4_ = auVar35._8_4_ * auVar44._8_4_;
            auVar38._12_4_ = auVar35._12_4_ * auVar44._12_4_;
            auVar39._0_4_ = auVar30._0_4_ * auVar44._0_4_;
            auVar39._4_4_ = auVar30._4_4_ * auVar44._4_4_;
            auVar39._8_4_ = auVar30._8_4_ * auVar44._8_4_;
            auVar39._12_4_ = auVar30._12_4_ * auVar44._12_4_;
            auVar54._0_4_ = auVar36._0_4_ * auVar60._0_4_;
            auVar54._4_4_ = auVar36._4_4_ * auVar60._4_4_;
            auVar54._8_4_ = auVar36._8_4_ * auVar60._8_4_;
            auVar54._12_4_ = auVar36._12_4_ * auVar60._12_4_;
            auVar57._0_4_ = auVar36._0_4_ * auVar35._0_4_;
            auVar57._4_4_ = auVar36._4_4_ * auVar35._4_4_;
            auVar57._8_4_ = auVar36._8_4_ * auVar35._8_4_;
            auVar57._12_4_ = auVar36._12_4_ * auVar35._12_4_;
            auVar59._0_4_ = auVar65._0_4_ * auVar30._0_4_;
            auVar59._4_4_ = auVar65._4_4_ * auVar30._4_4_;
            auVar59._8_4_ = auVar65._8_4_ * auVar30._8_4_;
            auVar59._12_4_ = auVar65._12_4_ * auVar30._12_4_;
            auVar36 = vcmpps_avx(auVar31,auVar38,5);
            auVar30 = vcmpps_avx(auVar39,auVar54,5);
            auVar35 = vcmpps_avx(auVar57,auVar59,5);
            auVar30 = vandps_avx(auVar30,auVar35);
            auVar30 = vandps_avx(auVar30,auVar36);
            auVar36 = vcmpps_avx(auVar39,auVar54,2);
            auVar35 = vcmpps_avx(auVar57,auVar59,2);
            auVar36 = vandps_avx(auVar36,auVar35);
            auVar35 = vcmpps_avx(auVar31,auVar38,2);
            auVar36 = vandps_avx(auVar36,auVar35);
            auVar30 = vorps_avx(auVar36,auVar30);
            auVar8._8_8_ = uStack_2588;
            auVar8._0_8_ = local_2590;
            auVar8 = auVar8 & auVar30;
            if ((((auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar8[0xf] < '\0') {
              auVar13._8_8_ = uStack_2588;
              auVar13._0_8_ = local_2590;
              auVar30 = vandps_avx(auVar30,auVar13);
              local_2580._0_16_ = vsubps_avx(auVar31,auVar38);
              local_2580._16_16_ = vsubps_avx(auVar39,auVar54);
              auVar65 = vsubps_avx(auVar57,auVar59);
              auVar40._0_4_ = auVar65._0_4_ + local_2580._0_4_ + local_2580._16_4_;
              auVar40._4_4_ = auVar65._4_4_ + local_2580._4_4_ + local_2580._20_4_;
              auVar40._8_4_ = auVar65._8_4_ + local_2580._8_4_ + local_2580._24_4_;
              auVar40._12_4_ = auVar65._12_4_ + local_2580._12_4_ + local_2580._28_4_;
              auVar36 = vcmpps_avx(auVar40,_DAT_01feba10,4);
              auVar35 = vrcpps_avx(auVar40);
              auVar60 = vfnmadd213ps_fma(auVar40,auVar35,auVar66._0_16_);
              local_2550 = vfmadd132ps_fma(auVar60,auVar35,auVar35);
              auVar42._0_4_ = local_2450 * auVar56._0_4_;
              auVar42._4_4_ = fStack_244c * auVar56._4_4_;
              auVar42._8_4_ = fStack_2448 * auVar56._8_4_;
              auVar42._12_4_ = fStack_2444 * auVar56._12_4_;
              auVar45._0_4_ = local_2450 * auVar41._0_4_;
              auVar45._4_4_ = fStack_244c * auVar41._4_4_;
              auVar45._8_4_ = fStack_2448 * auVar41._8_4_;
              auVar45._12_4_ = fStack_2444 * auVar41._12_4_;
              auVar48._0_4_ = auVar65._0_4_ * local_2450 * auVar37._0_4_;
              auVar48._4_4_ = auVar65._4_4_ * fStack_244c * auVar37._4_4_;
              auVar48._8_4_ = auVar65._8_4_ * fStack_2448 * auVar37._8_4_;
              auVar48._12_4_ = auVar65._12_4_ * fStack_2444 * auVar37._12_4_;
              auVar35 = vfmadd231ps_fma(auVar48,local_2580._16_16_,auVar45);
              auVar35 = vfmadd231ps_fma(auVar35,local_2580._0_16_,auVar42);
              fVar4 = local_2550._0_4_;
              local_2560._0_4_ = auVar35._0_4_ * fVar4;
              fVar5 = local_2550._4_4_;
              local_2560._4_4_ = auVar35._4_4_ * fVar5;
              fVar6 = local_2550._8_4_;
              local_2560._8_4_ = auVar35._8_4_ * fVar6;
              fVar7 = local_2550._12_4_;
              local_2560._12_4_ = auVar35._12_4_ * fVar7;
              uVar16 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar43._4_4_ = uVar16;
              auVar43._0_4_ = uVar16;
              auVar43._8_4_ = uVar16;
              auVar43._12_4_ = uVar16;
              auVar35 = vcmpps_avx(auVar43,local_2560,1);
              auVar36 = vandps_avx(auVar36,auVar35);
              fVar51 = (ray->super_RayK<1>).tfar;
              auVar46._4_4_ = fVar51;
              auVar46._0_4_ = fVar51;
              auVar46._8_4_ = fVar51;
              auVar46._12_4_ = fVar51;
              auVar35 = vcmpps_avx(local_2560,auVar46,2);
              auVar36 = vandps_avx(auVar36,auVar35);
              auVar35 = auVar30 & auVar36;
              if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar35[0xf] < '\0') {
                auVar30 = vandps_avx(auVar36,auVar30);
                auVar36 = vsubps_avx(pauVar27[6],*pauVar27);
                auVar35 = vsubps_avx(pauVar27[7],pauVar27[1]);
                auVar56 = vsubps_avx(*pauVar27,pauVar27[3]);
                auVar65 = vsubps_avx(pauVar27[1],pauVar27[4]);
                auVar41 = vsubps_avx(pauVar27[8],pauVar27[2]);
                auVar60 = vsubps_avx(pauVar27[2],pauVar27[5]);
                auVar61._0_4_ = auVar41._0_4_ * auVar65._0_4_;
                auVar61._4_4_ = auVar41._4_4_ * auVar65._4_4_;
                auVar61._8_4_ = auVar41._8_4_ * auVar65._8_4_;
                auVar61._12_4_ = auVar41._12_4_ * auVar65._12_4_;
                local_2500 = vfmsub231ps_fma(auVar61,auVar35,auVar60);
                auVar52._0_4_ = auVar60._0_4_ * auVar36._0_4_;
                auVar52._4_4_ = auVar60._4_4_ * auVar36._4_4_;
                auVar52._8_4_ = auVar60._8_4_ * auVar36._8_4_;
                auVar52._12_4_ = auVar60._12_4_ * auVar36._12_4_;
                local_24f0 = vfmsub231ps_fma(auVar52,auVar56,auVar41);
                auVar47._0_4_ = auVar35._0_4_ * auVar56._0_4_;
                auVar47._4_4_ = auVar35._4_4_ * auVar56._4_4_;
                auVar47._8_4_ = auVar35._8_4_ * auVar56._8_4_;
                auVar47._12_4_ = auVar35._12_4_ * auVar56._12_4_;
                local_24e0[0] = vfmsub231ps_fma(auVar47,auVar36,auVar65);
                local_2540 = auVar30;
                local_26a0 = auVar30;
                local_2510 = local_2560;
                local_2530[0] = local_2580._0_4_ * fVar4;
                local_2530[1] = local_2580._4_4_ * fVar5;
                local_2530[2] = local_2580._8_4_ * fVar6;
                local_2530[3] = local_2580._12_4_ * fVar7;
                local_2520[0] = fVar4 * local_2580._16_4_;
                local_2520[1] = fVar5 * local_2580._20_4_;
                local_2520[2] = fVar6 * local_2580._24_4_;
                local_2520[3] = fVar7 * local_2580._28_4_;
                auVar32._8_4_ = 0x7f800000;
                auVar32._0_8_ = 0x7f8000007f800000;
                auVar32._12_4_ = 0x7f800000;
                auVar36 = vblendvps_avx(auVar32,local_2560,auVar30);
                auVar35 = vshufps_avx(auVar36,auVar36,0xb1);
                auVar35 = vminps_avx(auVar35,auVar36);
                auVar56 = vshufpd_avx(auVar35,auVar35,1);
                auVar35 = vminps_avx(auVar56,auVar35);
                auVar36 = vcmpps_avx(auVar36,auVar35,0);
                auVar35 = auVar30 & auVar36;
                if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar35[0xf] < '\0') {
                  auVar30 = vandps_avx(auVar36,auVar30);
                }
                uVar18 = vmovmskps_avx(auVar30);
                piVar24 = (int *)0x0;
                for (uVar21 = (ulong)uVar18; (uVar21 & 1) == 0;
                    uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                  piVar24 = (int *)((long)piVar24 + 1);
                }
                local_2600 = context->scene;
                auVar30 = local_2560;
                do {
                  uVar18 = *(uint *)(pauVar27[9] + (long)piVar24 * 4);
                  pGVar2 = (local_2600->geometries).items[uVar18].ptr;
                  if ((pGVar2->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_26a0 + (long)piVar24 * 4) = 0;
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar2->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar51 = local_2530[(long)piVar24];
                      fVar4 = local_2520[(long)piVar24];
                      (ray->super_RayK<1>).tfar = *(float *)(local_2510 + (long)piVar24 * 4);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_2500 + (long)piVar24 * 4);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_24f0 + (long)piVar24 * 4);
                      (ray->Ng).field_0.field_0.z = *(float *)(local_24e0[0] + (long)piVar24 * 4);
                      ray->u = fVar51;
                      ray->v = fVar4;
                      ray->primID = *(uint *)(pauVar27[10] + (long)piVar24 * 4);
                      ray->geomID = uVar18;
                      pRVar3 = context->user;
                      ray->instID[0] = pRVar3->instID[0];
                      ray->instPrimID[0] = pRVar3->instPrimID[0];
                      break;
                    }
                    local_2688 = context->args;
                    local_2650 = auVar30;
                    local_2640 = auVar64._0_16_;
                    local_2630 = auVar63._0_16_;
                    local_2620 = auVar62._0_16_;
                    local_2680.context = context->user;
                    local_25c0 = *(float *)(local_2500 + (long)piVar24 * 4);
                    local_25bc = *(undefined4 *)(local_24f0 + (long)piVar24 * 4);
                    local_25b8 = *(undefined4 *)(local_24e0[0] + (long)piVar24 * 4);
                    local_25b4 = local_2530[(long)piVar24];
                    local_25b0 = local_2520[(long)piVar24];
                    local_25ac = *(undefined4 *)(pauVar27[10] + (long)piVar24 * 4);
                    local_25a8 = uVar18;
                    local_25a4 = (local_2680.context)->instID[0];
                    local_25a0 = (local_2680.context)->instPrimID[0];
                    fVar51 = (ray->super_RayK<1>).tfar;
                    local_2608 = piVar24;
                    (ray->super_RayK<1>).tfar = *(float *)(local_2510 + (long)piVar24 * 4);
                    local_26a4 = -1;
                    local_2680.valid = &local_26a4;
                    local_2680.geometryUserPtr = pGVar2->userPtr;
                    local_2680.ray = (RTCRayN *)ray;
                    local_2680.hit = (RTCHitN *)&local_25c0;
                    local_2680.N = 1;
                    local_2610 = pGVar2;
                    if ((pGVar2->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar2->intersectionFilterN)(&local_2680), *local_2680.valid != 0)) {
                      if (local_2688->filter != (RTCFilterFunctionN)0x0) {
                        if (((local_2688->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((local_2610->field_8).field_0x2 & 0x40) != 0)) {
                          (*local_2688->filter)(&local_2680);
                        }
                        if (*local_2680.valid == 0) goto LAB_01a5c372;
                      }
                      (((Vec3f *)((long)local_2680.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_2680.hit;
                      (((Vec3f *)((long)local_2680.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_2680.hit + 4);
                      (((Vec3f *)((long)local_2680.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_2680.hit + 8);
                      *(float *)((long)local_2680.ray + 0x3c) = *(float *)(local_2680.hit + 0xc);
                      *(float *)((long)local_2680.ray + 0x40) = *(float *)(local_2680.hit + 0x10);
                      *(float *)((long)local_2680.ray + 0x44) = *(float *)(local_2680.hit + 0x14);
                      *(float *)((long)local_2680.ray + 0x48) = *(float *)(local_2680.hit + 0x18);
                      *(float *)((long)local_2680.ray + 0x4c) = *(float *)(local_2680.hit + 0x1c);
                      *(float *)((long)local_2680.ray + 0x50) = *(float *)(local_2680.hit + 0x20);
                    }
                    else {
LAB_01a5c372:
                      (ray->super_RayK<1>).tfar = fVar51;
                    }
                    *(undefined4 *)(local_26a0 + (long)local_2608 * 4) = 0;
                    fVar51 = (ray->super_RayK<1>).tfar;
                    auVar33._4_4_ = fVar51;
                    auVar33._0_4_ = fVar51;
                    auVar33._8_4_ = fVar51;
                    auVar33._12_4_ = fVar51;
                    auVar30 = vcmpps_avx(local_2650,auVar33,2);
                    local_26a0 = vandps_avx(auVar30,local_26a0);
                    auVar62 = ZEXT1664(local_2620);
                    auVar63 = ZEXT1664(local_2630);
                    auVar64 = ZEXT1664(local_2640);
                    auVar66 = ZEXT1664(CONCAT412(0x3f800000,
                                                 CONCAT48(0x3f800000,&DAT_3f8000003f800000)));
                    auVar30 = local_2650;
                  }
                  if ((((local_26a0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_26a0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_26a0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_26a0[0xf]) break;
                  local_2620 = auVar62._0_16_;
                  local_2630 = auVar63._0_16_;
                  local_2640 = auVar64._0_16_;
                  local_2650 = auVar30;
                  BVHNIntersector1<8,1,false,embree::avx2::ArrayIntersector1<embree::avx2::TriangleMvIntersector1Woop<4,true>>>
                  ::intersect(&local_2680);
                  auVar66 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,&DAT_3f8000003f800000)
                                              ));
                  auVar64 = ZEXT1664(local_2640);
                  auVar63 = ZEXT1664(local_2630);
                  auVar62 = ZEXT1664(local_2620);
                  piVar24 = local_2680.valid;
                  auVar30 = local_2650;
                } while( true );
              }
            }
            lVar29 = lVar29 + 1;
          } while (lVar29 != uVar28 - 8);
        }
        fVar51 = (ray->super_RayK<1>).tfar;
        auVar34._4_4_ = fVar51;
        auVar34._0_4_ = fVar51;
        auVar34._8_4_ = fVar51;
        auVar34._12_4_ = fVar51;
        auVar34._16_4_ = fVar51;
        auVar34._20_4_ = fVar51;
        auVar34._24_4_ = fVar51;
        auVar34._28_4_ = fVar51;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }